

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_util.cpp
# Opt level: O3

EnumStringLiteral * duckdb::GetPartitionSortStageValues(void)

{
  return GetPartitionSortStageValues::values;
}

Assistant:

const StringUtil::EnumStringLiteral *GetPartitionSortStageValues() {
	static constexpr StringUtil::EnumStringLiteral values[] {
		{ static_cast<uint32_t>(PartitionSortStage::INIT), "INIT" },
		{ static_cast<uint32_t>(PartitionSortStage::SCAN), "SCAN" },
		{ static_cast<uint32_t>(PartitionSortStage::PREPARE), "PREPARE" },
		{ static_cast<uint32_t>(PartitionSortStage::MERGE), "MERGE" },
		{ static_cast<uint32_t>(PartitionSortStage::SORTED), "SORTED" },
		{ static_cast<uint32_t>(PartitionSortStage::FINISHED), "FINISHED" }
	};
	return values;
}